

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

void __thiscall toml::detail::location::reset(location *this,const_iterator rollback)

{
  difference_type dVar1;
  char local_51;
  location *local_50;
  char *local_48;
  char local_39;
  char *local_38;
  location *local_30;
  char *local_28;
  char *local_20;
  location *local_18;
  location *this_local;
  const_iterator rollback_local;
  
  local_28 = (this->iter_)._M_current;
  local_20 = rollback._M_current;
  local_18 = this;
  this_local = (location *)rollback._M_current;
  dVar1 = std::
          distance<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                    ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                     rollback._M_current,
                     (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                     local_28);
  if (dVar1 < 0) {
    local_48 = (this->iter_)._M_current;
    local_50 = this_local;
    local_51 = '\n';
    dVar1 = std::
            count<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,char>
                      ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                       local_48,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                                 )this_local,&local_51);
    this->line_number_ = dVar1 + this->line_number_;
  }
  else {
    local_30 = this_local;
    local_38 = (this->iter_)._M_current;
    local_39 = '\n';
    dVar1 = std::
            count<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,char>
                      ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                       this_local,
                       (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                       local_38,&local_39);
    this->line_number_ = this->line_number_ - dVar1;
  }
  (this->iter_)._M_current = (char *)this_local;
  return;
}

Assistant:

void reset(const_iterator rollback) noexcept
    {
        // since c++11, std::distance works in both ways for random-access
        // iterators and returns a negative value if `first > last`.
        if(0 <= std::distance(rollback, this->iter_)) // rollback < iter
        {
            this->line_number_ -= static_cast<std::size_t>(
                    std::count(rollback, this->iter_, '\n'));
        }
        else // iter < rollback [[unlikely]]
        {
            this->line_number_ += static_cast<std::size_t>(
                    std::count(this->iter_, rollback, '\n'));
        }
        this->iter_ = rollback;
        return;
    }